

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

bool __thiscall
Parser::parseFunctionDeclaration
          (Parser *this,Identifier *name,vector<Identifier,_std::allocator<Identifier>_> *parameters
          )

{
  Tokenizer *pTVar1;
  Token *pTVar2;
  Identifier *__args;
  
  pTVar2 = peekToken(this,0);
  if (pTVar2->type == Identifier) {
    pTVar2 = nextToken(this);
    Token::identifierValue(pTVar2);
    std::__cxx11::string::_M_assign((string *)name);
    pTVar2 = nextToken(this);
    if (pTVar2->type == LParen) {
      std::vector<Identifier,_std::allocator<Identifier>_>::clear(parameters);
      while (pTVar1 = (this->entries).
                      super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
                      _M_impl.super__Vector_impl_data._M_finish[-1].tokenizer,
            *(Tokenizer **)&pTVar1->position != pTVar1) {
        pTVar2 = peekToken(this,0);
        if (pTVar2->type == RParen) {
          pTVar1 = (this->entries).
                   super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>._M_impl
                   .super__Vector_impl_data._M_finish[-1].tokenizer;
          if (*(Tokenizer **)&pTVar1->position == pTVar1) {
            return false;
          }
          pTVar2 = nextToken(this);
          return pTVar2->type == RParen;
        }
        if (((parameters->super__Vector_base<Identifier,_std::allocator<Identifier>_>)._M_impl.
             super__Vector_impl_data._M_start !=
             (parameters->super__Vector_base<Identifier,_std::allocator<Identifier>_>)._M_impl.
             super__Vector_impl_data._M_finish) &&
           (pTVar2 = peekToken(this,0), pTVar2->type == Comma)) {
          eatToken(this);
        }
        pTVar2 = nextToken(this);
        if (pTVar2->type != Identifier) {
          return false;
        }
        __args = Token::identifierValue(pTVar2);
        std::vector<Identifier,std::allocator<Identifier>>::emplace_back<Identifier_const&>
                  ((vector<Identifier,std::allocator<Identifier>> *)parameters,__args);
      }
    }
  }
  return false;
}

Assistant:

bool Parser::parseFunctionDeclaration(Identifier& name, std::vector<Identifier> &parameters)
{
	const Token& first = peekToken();
	if (first.type != TokenType::Identifier)
		return false;

	name = nextToken().identifierValue();

	if (nextToken().type != TokenType::LParen)
		return false;

	parameters.clear();
	while (!atEnd() && peekToken().type != TokenType::RParen)
	{
		if (!parameters.empty() && peekToken().type == TokenType::Comma)
			eatToken();

		const Token& token = nextToken();
		if (token.type != TokenType::Identifier)
			return false;

		parameters.emplace_back(token.identifierValue());
	}

	return !atEnd() && nextToken().type == TokenType::RParen;
}